

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O1

dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this,size_type pos)

{
  ulong *puVar1;
  byte bVar2;
  
  if (pos < this->m_num_bits) {
    bVar2 = (byte)pos & 0x3f;
    puVar1 = (this->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start + (pos >> 6);
    *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
    return this;
  }
  __assert_fail("pos < m_num_bits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                ,0x3d2,
                "dynamic_bitset<Block, Allocator> &boost::dynamic_bitset<>::reset(size_type) [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
               );
}

Assistant:

dynamic_bitset<Block, Allocator>&
dynamic_bitset<Block, Allocator>::reset(size_type pos)
{
    assert(pos < m_num_bits);
#if defined __MWERKS__ && BOOST_WORKAROUND(__MWERKS__, <= 0x3003) // 8.x
    // CodeWarrior 8 generates incorrect code when the &=~ is compiled,
    // use the |^ variation instead.. <grafik>
    m_bits[block_index(pos)] |= bit_mask(pos);
    m_bits[block_index(pos)] ^= bit_mask(pos);
#else
    m_bits[block_index(pos)] &= ~bit_mask(pos);
#endif
    return *this;
}